

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_parse.cc
# Opt level: O1

bool absl::anon_unknown_0::ParseInfinityOrNan(char *begin,char *end,ParsedFloat *out)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  
  if ((long)end - (long)begin < 3) {
    return false;
  }
  bVar1 = *begin;
  if (bVar1 < 0x69) {
    if (bVar1 == 0x49) {
LAB_0027591b:
      iVar2 = strings_internal::memcasecmp(begin + 1,"nf",2);
      if (iVar2 != 0) {
        return false;
      }
      out->type = kInfinity;
      if (((long)end - (long)begin < 8) ||
         (iVar2 = strings_internal::memcasecmp(begin + 3,"inity",5), iVar2 != 0)) {
        pcVar4 = begin + 3;
      }
      else {
        pcVar4 = begin + 8;
      }
      out->end = pcVar4;
      return true;
    }
    if (bVar1 != 0x4e) {
      return false;
    }
  }
  else if (bVar1 != 0x6e) {
    if (bVar1 != 0x69) {
      return false;
    }
    goto LAB_0027591b;
  }
  iVar2 = strings_internal::memcasecmp(begin + 1,"an",2);
  if (iVar2 != 0) {
    return false;
  }
  out->type = kNan;
  pcVar4 = begin + 3;
  out->end = pcVar4;
  if (end <= pcVar4) {
    return true;
  }
  if (*pcVar4 != '(') {
    return true;
  }
  pbVar5 = (byte *)(begin + 4);
  pbVar3 = pbVar5;
  if (pbVar5 < end) {
    while (((bVar1 = *pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a || (bVar1 == 0x5f)) ||
           ((byte)(bVar1 - 0x30) < 10))) {
      pbVar3 = pbVar3 + 1;
      if (pbVar3 == (byte *)end) {
        return true;
      }
    }
    if (bVar1 == 0x29) {
      out->subrange_begin = (char *)pbVar5;
      out->subrange_end = (char *)pbVar3;
      out->end = (char *)(pbVar3 + 1);
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool ParseInfinityOrNan(const char* begin, const char* end,
                        strings_internal::ParsedFloat* out) {
  if (end - begin < 3) {
    return false;
  }
  switch (*begin) {
    case 'i':
    case 'I': {
      // An infinity string consists of the characters "inf" or "infinity",
      // case insensitive.
      if (strings_internal::memcasecmp(begin + 1, "nf", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kInfinity;
      if (end - begin >= 8 &&
          strings_internal::memcasecmp(begin + 3, "inity", 5) == 0) {
        out->end = begin + 8;
      } else {
        out->end = begin + 3;
      }
      return true;
    }
    case 'n':
    case 'N': {
      // A NaN consists of the characters "nan", case insensitive, optionally
      // followed by a parenthesized sequence of zero or more alphanumeric
      // characters and/or underscores.
      if (strings_internal::memcasecmp(begin + 1, "an", 2) != 0) {
        return false;
      }
      out->type = strings_internal::FloatType::kNan;
      out->end = begin + 3;
      // NaN is allowed to be followed by a parenthesized string, consisting of
      // only the characters [a-zA-Z0-9_].  Match that if it's present.
      begin += 3;
      if (begin < end && *begin == '(') {
        const char* nan_begin = begin + 1;
        while (nan_begin < end && IsNanChar(*nan_begin)) {
          ++nan_begin;
        }
        if (nan_begin < end && *nan_begin == ')') {
          // We found an extra NaN specifier range
          out->subrange_begin = begin + 1;
          out->subrange_end = nan_begin;
          out->end = nan_begin + 1;
        }
      }
      return true;
    }
    default:
      return false;
  }
}